

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O2

int __thiscall TPZCheckMesh::CheckConstraintDimension(TPZCheckMesh *this)

{
  int64_t iVar1;
  int iVar2;
  int iVar3;
  TPZConnect *pTVar4;
  ostream *poVar5;
  TPZCompEl *pTVar6;
  long lVar7;
  long lVar8;
  iterator iVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  long iel;
  int ic;
  int iVar13;
  int i;
  TPZDepend **ppTVar14;
  int iVar15;
  _Self __tmp_1;
  int iVar16;
  TPZDepend *dep;
  TPZDepend *pTVar17;
  pair<std::_Rb_tree_iterator<long>,_bool> pVar18;
  int local_20c;
  TPZCompElSide large;
  set<long,_std::less<long>,_std::allocator<long>_> largecon;
  long local_1b8;
  TPZVec<long> connecttoel;
  TPZCompElSide local_190;
  TPZGeoElSide gelside;
  set<long,_std::less<long>,_std::allocator<long>_> badelements;
  set<long,_std::less<long>,_std::allocator<long>_> badcon;
  TPZGeoElSide gellarge;
  TPZStack<TPZCompElSide,_10> equal;
  
  iVar1 = (this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  badcon._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &badcon._M_t._M_impl.super__Rb_tree_header._M_header;
  badcon._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  badcon._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  badcon._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_20c = 0;
  badcon._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       badcon._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
            (_func_int **)0x0;
      (long)equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec <
      (long)(int)iVar1;
      equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
           (_func_int **)
           ((long)equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  _vptr_TPZVec + 1)) {
    pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                        (int64_t)equal.super_TPZManVector<TPZCompElSide,_10>.
                                 super_TPZVec<TPZCompElSide>._vptr_TPZVec);
    uVar11 = (uint)pTVar4->fSequenceNumber;
    if ((-1 < (int)uVar11) && (pTVar17 = pTVar4->fDependList, pTVar17 != (TPZDepend *)0x0)) {
      iVar2 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[uVar11 & 0x7fffffff]
              .dim;
      for (; pTVar17 != (TPZDepend *)0x0; pTVar17 = pTVar17->fNext) {
        iVar16 = (int)(pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                      super_TPZBaseMatrix.fRow;
        iVar3 = (int)(pTVar17->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fCol;
        iVar15 = (int)pTVar17->fDepConnectIndex;
        pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                            (long)iVar15);
        iVar13 = (this->fMesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                 [(int)pTVar4->fSequenceNumber].dim;
        if ((this->fNState * iVar16 != iVar2) || (this->fNState * iVar3 != iVar13)) {
          std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&badcon,(long *)&equal);
          poVar5 = std::operator<<((ostream *)&std::cout,"TPZCheckMesh::CheckConstraintDi.. ic = ");
          poVar5 = std::ostream::_M_insert<long>((long)poVar5);
          poVar5 = std::operator<<(poVar5," depends on ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar15);
          poVar5 = std::operator<<(poVar5," r ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar16);
          poVar5 = std::operator<<(poVar5," iblsize ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
          poVar5 = std::operator<<(poVar5," c ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
          poVar5 = std::operator<<(poVar5," jblsize ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar13);
          std::endl<char,std::char_traits<char>>(poVar5);
          local_20c = 1;
        }
      }
    }
  }
  equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
       (_func_int **)0xffffffffffffffff;
  TPZVec<long>::TPZVec
            (&connecttoel,(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements
             ,(long *)&equal);
  lVar8 = (this->fMesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  iel = 0;
  if (lVar8 < 1) {
    lVar8 = iel;
  }
  for (; iel != lVar8; iel = iel + 1) {
    pTVar6 = TPZCompMesh::Element(this->fMesh,iel);
    if (pTVar6 != (TPZCompEl *)0x0) {
      iVar2 = (**(code **)(*(long *)pTVar6 + 0x90))(pTVar6);
      iVar16 = 0;
      if (iVar2 < 1) {
        iVar2 = iVar16;
      }
      for (; iVar2 != iVar16; iVar16 = iVar16 + 1) {
        lVar7 = (**(code **)(*(long *)pTVar6 + 0xa0))(pTVar6,iVar16);
        if (connecttoel.fStore[lVar7] == -1) {
          connecttoel.fStore[lVar7] = iel;
        }
      }
    }
  }
  badelements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &badelements._M_t._M_impl.super__Rb_tree_header._M_header;
  badelements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  badelements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  badelements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  badelements._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       badelements._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var10 = badcon._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &badcon._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    lVar8 = connecttoel.fStore[*(long *)(p_Var10 + 1)];
    if (lVar8 == -1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Connect ");
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::operator<<(poVar5," has dependency but does not belong to an element\n");
      lVar8 = connecttoel.fStore[*(long *)(p_Var10 + 1)];
    }
    pTVar6 = TPZCompMesh::Element(this->fMesh,lVar8);
    if ((pTVar6 == (TPZCompEl *)0x0) ||
       (pTVar6 = (TPZCompEl *)
                 __dynamic_cast(pTVar6,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0),
       pTVar6 == (TPZCompEl *)0x0)) {
      std::operator<<((ostream *)&std::cout,"I dont understand\n");
    }
    else {
      iVar2 = (**(code **)(*(long *)pTVar6 + 0x90))();
      iVar16 = 0;
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      while( true ) {
        if (iVar16 == iVar2) break;
        lVar8 = (**(code **)(*(long *)pTVar6 + 0xa0))();
        if (lVar8 == *(long *)(p_Var10 + 1)) {
          gelside.fGeoEl = TPZCompEl::Reference(pTVar6);
          gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
          gelside.fSide = iVar16;
          TPZGeoElSide::LowerLevelCompElementList2((TPZGeoElSide *)&large,(int)&gelside);
          if (large.fEl == (TPZCompEl *)0x0) {
            std::operator<<((ostream *)&std::cout,"I dont understand\n");
          }
          else {
            TPZCompElSide::Reference(&gellarge,&large);
            TPZStack<TPZCompElSide,_10>::TPZStack(&equal);
            TPZGeoElSide::EqualLevelCompElementList(&gellarge,&equal,1,0);
            local_190.fEl = large.fEl;
            local_190.fSide = large.fSide;
            TPZStack<TPZCompElSide,_10>::Push(&equal,&local_190);
            poVar5 = std::operator<<((ostream *)&std::cout,"Connect index ");
            poVar5 = std::ostream::_M_insert<long>((long)poVar5);
            poVar5 = std::operator<<(poVar5," belongs to element ");
            poVar5 = std::ostream::_M_insert<long>((long)poVar5);
            std::operator<<(poVar5," and is restrained by element ");
            for (lVar8 = 0;
                lVar8 < equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                        fNElements; lVar8 = lVar8 + 1) {
              poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
              std::operator<<(poVar5," ");
            }
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            largecon._M_t._M_impl._0_8_ = (large.fEl)->fIndex;
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::_M_insert_unique<long>(&badelements._M_t,(long *)&largecon);
            iVar3 = (**(code **)(*(long *)large.fEl + 0x90))();
            largecon._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            largecon._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            largecon._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &largecon._M_t._M_impl.super__Rb_tree_header._M_header;
            largecon._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            iVar13 = 0;
            uVar12 = extraout_RDX;
            largecon._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 largecon._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if (iVar3 < 1) {
              iVar3 = iVar13;
            }
            for (; iVar3 != iVar13; iVar13 = iVar13 + 1) {
              local_1b8 = (**(code **)(*(long *)large.fEl + 0xa0))(large.fEl,iVar13,uVar12);
              pVar18 = std::
                       _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                       ::_M_insert_unique<long>(&largecon._M_t,&local_1b8);
              uVar12 = pVar18._8_8_;
            }
            pTVar4 = TPZChunkVector<TPZConnect,_10>::operator[]
                               (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                                *(int64_t *)(p_Var10 + 1));
            ppTVar14 = &pTVar4->fDependList;
            while (pTVar17 = *ppTVar14, pTVar17 != (TPZDepend *)0x0) {
              iVar9 = std::
                      _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
                      ::find(&largecon._M_t,&pTVar17->fDepConnectIndex);
              if ((_Rb_tree_header *)iVar9._M_node == &largecon._M_t._M_impl.super__Rb_tree_header)
              {
                poVar5 = std::operator<<((ostream *)&std::cout,"The connect ");
                poVar5 = std::ostream::_M_insert<long>((long)poVar5);
                poVar5 = std::operator<<(poVar5," belongs to element ");
                poVar5 = std::ostream::_M_insert<long>((long)poVar5);
                poVar5 = std::operator<<(poVar5," as connect ");
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar16);
                std::endl<char,std::char_traits<char>>(poVar5);
                poVar5 = std::operator<<((ostream *)&std::cout,
                                         "The element is restrained along this side to element ");
                poVar5 = std::ostream::_M_insert<long>((long)poVar5);
                std::endl<char,std::char_traits<char>>(poVar5);
                poVar5 = std::operator<<((ostream *)&std::cout,"The connect ");
                poVar5 = std::ostream::_M_insert<long>((long)poVar5);
                poVar5 = std::operator<<(poVar5," depends on connect ");
                poVar5 = std::ostream::_M_insert<long>((long)poVar5);
                std::operator<<(poVar5," The connect of the large element are ");
                for (iVar13 = 0; iVar3 != iVar13; iVar13 = iVar13 + 1) {
                  (**(code **)(*(long *)large.fEl + 0xa0))(large.fEl,iVar13);
                  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
                  std::operator<<(poVar5," ");
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              ppTVar14 = &pTVar17->fNext;
            }
            std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>
            ::~_Rb_tree(&largecon._M_t);
            TPZManVector<TPZCompElSide,_10>::~TPZManVector
                      (&equal.super_TPZManVector<TPZCompElSide,_10>);
          }
        }
        iVar16 = iVar16 + 1;
      }
    }
  }
  for (p_Var10 = badelements._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &badelements._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    pTVar6 = TPZCompMesh::Element(this->fMesh,*(int64_t *)(p_Var10 + 1));
    (**(code **)(*(long *)pTVar6 + 200))(pTVar6,&std::cout);
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&badelements._M_t);
  TPZVec<long>::~TPZVec(&connecttoel);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&badcon._M_t);
  return local_20c;
}

Assistant:

int TPZCheckMesh::CheckConstraintDimension()
{
	int check = 0;
	int ncon = fMesh->ConnectVec().NElements();
    std::set<int64_t> badcon;
	for(int64_t ic=0; ic<ncon; ic++) {
		TPZConnect &con = fMesh->ConnectVec()[ic];
		int iseqnum = con.SequenceNumber();
        if (iseqnum < 0) {
            continue;
        }
		int iblsize = fMesh->Block().Size(iseqnum);
		if(con.HasDependency()) {
			TPZConnect::TPZDepend *dep = con.FirstDepend();
			while(dep) {
				int r = dep->fDepMatrix.Rows();
				int c = dep->fDepMatrix.Cols();
				int jcind = dep->fDepConnectIndex;
				TPZConnect &jcon = fMesh->ConnectVec()[jcind];
				int jseqnum = jcon.SequenceNumber();
				int jblsize = fMesh->Block().Size(jseqnum);
				if(r*fNState != iblsize || c*fNState != jblsize) {
                    badcon.insert(ic);
					cout << "TPZCheckMesh::CheckConstraintDi.. ic = " << ic
					<< " depends on " << jcind << " r " << r << " iblsize "
					<< iblsize  << " c " << c << " jblsize " << jblsize << endl;
					check = 1;
				}
				dep = dep->fNext;
			}
		}
	}
    TPZVec<int64_t> connecttoel(fMesh->NConnects(),-1);
    int64_t nelem = fMesh->NElements();
    for (int64_t el=0; el<nelem; el++) {
        TPZCompEl *cel = fMesh->Element(el);
        if (!cel) {
            continue;
        }
        int nc = cel->NConnects();
        for (int ic=0; ic<nc; ic++) {
            int64_t cindex = cel->ConnectIndex(ic);
            if (connecttoel[cindex] == -1) {
                connecttoel[cindex] = el;
            }
        }
    }
    std::set<int64_t> badelements;
    for (std::set<int64_t>::iterator it = badcon.begin(); it != badcon.end(); it++) {
        /// find the element that contains badcon
        if (connecttoel[*it] == -1) {
            std::cout << "Connect " << *it << " has dependency but does not belong to an element\n";
        }
        TPZCompEl *cel = fMesh->Element(connecttoel[*it]);
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        if (!intel) {
            std::cout << "I dont understand\n";
            continue;
        }
        int nc = intel->NConnects();
        for (int ic = 0; ic<nc; ic++) {
            if (intel->ConnectIndex(ic) == *it)
            {
                TPZGeoEl *ref = intel->Reference();
                TPZGeoElSide gelside(ref,ic);
                TPZCompElSide large = gelside.LowerLevelCompElementList2(1);
                if (!large) {
                    std::cout << "I dont understand\n";
                    continue;
                }
                TPZGeoElSide gellarge = large.Reference();
                TPZStack<TPZCompElSide> equal;
                gellarge.EqualLevelCompElementList(equal, 1, 0);
                equal.Push(large);
                std::cout << "Connect index " << *it << " belongs to element " << connecttoel[*it] << " and is restrained by element ";
                for(int i=0; i< equal.size(); i++) std::cout << equal[i].Element()->Index() << " ";
                std::cout << std::endl;
                badelements.insert(large.Element()->Index());
                
                int nclarge = large.Element()->NConnects();
                std::set<int64_t> largecon;
                for (int icl=0; icl< nclarge; icl++) {
                    largecon.insert(large.Element()->ConnectIndex(icl));
                }
                TPZConnect &c = fMesh->ConnectVec()[*it];
                TPZConnect::TPZDepend *dep = c.FirstDepend();
                while(dep)
                {
                    if (largecon.find(dep->fDepConnectIndex) == largecon.end()) {
                        std::cout << "The connect " << *it << " belongs to element " << connecttoel[*it] << " as connect " << ic << std::endl;
                        std::cout << "The element is restrained along this side to element " << large.Element()->Index() << std::endl;
                        std::cout << "The connect " << *it << " depends on connect " << dep->fDepConnectIndex << " The connect of the large element are ";
                        for (int ic=0; ic<nclarge; ic++) {
                            std::cout << large.Element()->ConnectIndex(ic) << " ";
                        }
                        std::cout << std::endl;
                    }
                    dep = dep->fNext;
                }
            }
        }
    }
    for (std::set<int64_t>::iterator it=badelements.begin(); it != badelements.end(); it++) {
        fMesh->Element(*it)->Print();
    }
	return check;
}